

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O1

CURLcode Curl_readwrite(connectdata *conn,Curl_easy *data,_Bool *done,_Bool *comeback)

{
  _Bool *p_Var1;
  int *piVar2;
  long *plVar3;
  curl_off_t *pcVar4;
  char **ppcVar5;
  char cVar6;
  ushort uVar7;
  _func_CURLcode_Curl_easy_ptr_connectdata_ptr_ssize_t_ptr__Bool_ptr *p_Var8;
  contenc_writer *writer;
  void *pvVar9;
  curl_off_t cVar10;
  long lVar11;
  undefined8 uVar12;
  undefined4 uVar13;
  undefined8 uVar14;
  undefined4 uVar15;
  undefined8 uVar16;
  undefined4 uVar17;
  undefined8 uVar18;
  undefined4 uVar19;
  _Bool _Var20;
  CURLcode CVar21;
  CHUNKcode code;
  int iVar22;
  CURLcode CVar23;
  size_t sVar24;
  char *pcVar25;
  timediff_t tVar26;
  size_t sVar27;
  long lVar28;
  Curl_handler *pCVar29;
  _Bool *p_Var30;
  _Bool *p_Var31;
  _Bool *extraout_RDX;
  _Bool *extraout_RDX_00;
  _Bool *extraout_RDX_01;
  _Bool *extraout_RDX_02;
  _Bool *extraout_RDX_03;
  _Bool *extraout_RDX_04;
  _Bool *extraout_RDX_05;
  _Bool *extraout_RDX_06;
  _Bool *extraout_RDX_07;
  char *pcVar32;
  _Bool *extraout_RDX_08;
  _Bool *extraout_RDX_09;
  _Bool *extraout_RDX_10;
  _Bool *extraout_RDX_11;
  _Bool *extraout_RDX_12;
  _Bool *extraout_RDX_13;
  _Bool *extraout_RDX_14;
  _Bool *extraout_RDX_15;
  _Bool *extraout_RDX_16;
  _Bool *extraout_RDX_17;
  _Bool *extraout_RDX_18;
  _Bool *extraout_RDX_19;
  _Bool *p_Var33;
  uint uVar34;
  curl_socket_t readfd0;
  uint uVar35;
  bool bVar36;
  curltime newer;
  curltime newer_00;
  curltime older;
  curltime older_00;
  curltime cVar37;
  _Bool readmore;
  ssize_t bytes_written;
  _Bool local_75;
  CURLcode local_74;
  _Bool *local_70;
  _Bool local_61;
  _Bool *local_60;
  CHUNKcode local_54;
  _Bool *local_50;
  uint local_44;
  _Bool *local_40;
  _Bool *local_38;
  
  uVar34 = conn->cselect_bits;
  conn->cselect_bits = 0;
  uVar35 = (data->req).keepon;
  p_Var31 = (_Bool *)0xffffffff;
  readfd0 = -1;
  if ((uVar35 & 0x15) == 1) {
    readfd0 = conn->sockfd;
  }
  if ((uVar35 & 0x2a) == 2) {
    p_Var31 = (_Bool *)(ulong)(uint)conn->writesockfd;
  }
  uVar34 = uVar34 | (conn->data->state).drain != 0;
  if (uVar34 == 0) {
    uVar34 = Curl_socket_check(readfd0,-1,(curl_socket_t)p_Var31,0);
    p_Var31 = extraout_RDX;
  }
  if (uVar34 == 4) {
    Curl_failf(data,"select/poll returned error");
    comeback = (_Bool *)0x37;
    goto LAB_0012b078;
  }
  uVar35 = 0;
  if ((((data->req).keepon & 1) != 0) &&
     (((uVar34 & 1) != 0 || (uVar35 = 0, ((conn->bits).field_0x6 & 0x40) != 0)))) {
    local_75 = false;
    *done = false;
    *comeback = false;
    iVar22 = 100;
    local_60 = (_Bool *)((ulong)local_60 & 0xffffffff00000000);
    local_40 = (_Bool *)0x0;
    CVar21 = CURLE_OK;
    local_50 = done;
    local_38 = comeback;
    do {
      sVar27 = (data->set).buffer_size;
      lVar28 = (data->req).size;
      if (((lVar28 != -1) && (((data->req).field_0x570 & 1) == 0)) &&
         (sVar24 = lVar28 - (data->req).bytecount, (long)sVar24 < (long)sVar27)) {
        sVar27 = sVar24;
      }
      if (sVar27 == 0) {
        local_70 = (_Bool *)0x0;
LAB_0012a476:
        if ((((data->req).bytecount == 0) && ((data->req).writebytecount == 0)) &&
           (Curl_pgrsTime(data,TIMER_STARTTRANSFER), p_Var31 = extraout_RDX_01,
           (data->req).exp100 != EXP100_SEND_DATA)) {
          cVar37 = Curl_now();
          p_Var31 = cVar37._8_8_;
          (data->req).start100.tv_sec = cVar37.tv_sec;
          (data->req).start100.tv_usec = cVar37.tv_usec;
        }
        if (local_70 == (_Bool *)0x0) {
          p_Var31 = (_Bool *)CONCAT71((int7)((ulong)p_Var31 >> 8),(data->req).bodywrites == 0);
        }
        else {
          p_Var31 = (_Bool *)0x0;
        }
        if ((long)local_70 < 1 && ((ulong)p_Var31 & 1) == 0) {
          piVar2 = &(data->req).keepon;
          *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
          uVar35 = 2;
LAB_0012a544:
          local_60 = (_Bool *)CONCAT44(local_60._4_4_,1);
        }
        else {
          local_44 = (uint)p_Var31;
          (data->req).buf[(long)local_70] = '\0';
          (data->req).str = (data->req).buf;
          p_Var8 = conn->handler->readwrite;
          if (p_Var8 != (_func_CURLcode_Curl_easy_ptr_connectdata_ptr_ssize_t_ptr__Bool_ptr *)0x0) {
            CVar21 = (*p_Var8)(data,conn,(ssize_t *)&local_70,&local_75);
            local_60 = (_Bool *)CONCAT44(local_60._4_4_,1);
            p_Var31 = extraout_RDX_02;
            if (CVar21 != CURLE_OK) goto LAB_0012a52a;
            CVar21 = CURLE_OK;
            uVar35 = 2;
            if (local_75 != false) goto LAB_0012a54c;
          }
          if (((data->req).field_0x570 & 1) != 0) {
            local_61 = false;
            CVar23 = Curl_http_readwrite_headers(data,conn,(ssize_t *)&local_70,&local_61);
            local_60 = (_Bool *)CONCAT44(local_60._4_4_,1);
            p_Var31 = extraout_RDX_04;
            if (CVar23 == CURLE_OK) {
              p_Var8 = conn->handler->readwrite;
              if (((p_Var8 == (_func_CURLcode_Curl_easy_ptr_connectdata_ptr_ssize_t_ptr__Bool_ptr *)
                              0x0) || (0 < (data->req).maxdownload)) || ((long)local_70 < 1)) {
LAB_0012a636:
                if (local_61 == true) {
                  uVar35 = 2;
                  p_Var31 = local_70;
                  if (0 < (long)local_70) {
                    Curl_infof(data,"Excess found: excess = %zd url = %s (zero-length body)\n");
                    p_Var31 = extraout_RDX_06;
                  }
                  bVar36 = false;
                }
                else {
                  uVar35 = 0;
                  bVar36 = true;
                }
                CVar21 = CURLE_OK;
              }
              else {
                CVar23 = (*p_Var8)(data,conn,(ssize_t *)&local_70,&local_75);
                CVar21 = CURLE_OK;
                p_Var31 = extraout_RDX_05;
                if (CVar23 != CURLE_OK) goto LAB_0012a5d4;
                if (local_75 == false) goto LAB_0012a636;
                uVar35 = 2;
                bVar36 = false;
              }
            }
            else {
LAB_0012a5d4:
              CVar21 = CVar23;
              bVar36 = false;
              uVar35 = 1;
              local_74 = CVar21;
            }
            if (!bVar36) goto LAB_0012a54c;
          }
          uVar35 = local_44;
          if ((((data->req).str == (char *)0x0) ||
              (uVar7 = *(ushort *)&(data->req).field_0x570, (uVar7 & 1) != 0)) ||
             ((long)local_70 < 1 && (local_44 & 1) == 0)) {
LAB_0012a7a8:
            p_Var8 = conn->handler->readwrite;
            if (((p_Var8 == (_func_CURLcode_Curl_easy_ptr_connectdata_ptr_ssize_t_ptr__Bool_ptr *)
                            0x0) || (local_40 == (_Bool *)0x0)) ||
               (((conn->bits).field_0x6 & 0x40) != 0)) {
              if ((char)uVar35 != '\0') {
                piVar2 = &(data->req).keepon;
                *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
              }
              uVar35 = (uint)(data->req).keepon >> 3 & 2;
              goto LAB_0012a544;
            }
            pcVar25 = (data->req).str + (long)local_70;
            (data->req).str = pcVar25;
            pcVar32 = (data->req).buf + (data->set).buffer_size;
            local_70 = local_40;
            if (pcVar32 < pcVar25 + (long)local_40) {
              local_70 = (_Bool *)(pcVar32 + -(long)pcVar25);
            }
            local_40 = local_70;
            CVar21 = (*p_Var8)(data,conn,(ssize_t *)&local_70,&local_75);
            local_60 = (_Bool *)CONCAT44(local_60._4_4_,1);
            p_Var31 = extraout_RDX_08;
            if (CVar21 != CURLE_OK) goto LAB_0012a52a;
            uVar35 = 2;
            CVar21 = CURLE_OK;
            if (local_75 == true) {
              piVar2 = &(data->req).keepon;
              *(byte *)piVar2 = (byte)*piVar2 | 1;
              CVar21 = CURLE_OK;
            }
          }
          else {
            if (((data->set).field_0x87b & 0x10) == 0) {
              if (((data->req).bodywrites != 0 || (local_44 & 1) != 0) ||
                 ((conn->handler->protocol & 0x40003) == 0)) {
LAB_0012a8d2:
                plVar3 = &(data->req).bodywrites;
                *plVar3 = *plVar3 + 1;
                if ((((data->set).field_0x87b & 0x40) != 0) &&
                   (((data->req).badheader == HEADER_NORMAL ||
                    (Curl_debug(data,CURLINFO_DATA_IN,(data->state).headerbuff,(data->req).hbuflen),
                    (data->req).badheader == HEADER_PARTHEADER)))) {
                  Curl_debug(data,CURLINFO_DATA_IN,(data->req).str,(size_t)local_70);
                }
                if (((data->req).field_0x570 & 0x20) != 0) {
                  code = Curl_httpchunk_read(conn,(data->req).str,(ssize_t)local_70,
                                             (ssize_t *)&local_70);
                  if (code < CHUNKE_TOO_LONG_HEX) {
                    p_Var31 = extraout_RDX_10;
                    if (code == CHUNKE_STOP) {
                      piVar2 = &(data->req).keepon;
                      *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
                      p_Var31 = (_Bool *)(conn->chunk).dataleft;
                      if (p_Var31 != (_Bool *)0x0) {
                        local_54 = code;
                        Curl_infof(conn->data,"Leftovers after chunking: %zu bytes\n");
                        p_Var31 = extraout_RDX_12;
                        code = local_54;
                      }
                    }
                  }
                  else if (code == CHUNKE_WRITE_ERROR) {
                    local_54 = code;
                    Curl_failf(data,"Failed writing data");
                    local_74 = CURLE_WRITE_ERROR;
                    p_Var31 = extraout_RDX_11;
                    code = local_54;
                  }
                  else {
                    local_54 = code;
                    pcVar25 = Curl_chunked_strerror(code);
                    Curl_failf(data,"%s in chunked-encoding",pcVar25);
                    local_74 = CURLE_RECV_ERROR;
                    p_Var31 = extraout_RDX_13;
                    code = local_54;
                  }
                  local_60 = (_Bool *)CONCAT44(local_60._4_4_,1);
                  if (CHUNKE_OK < code) goto LAB_0012a89d;
                }
                if (((data->req).badheader == HEADER_PARTHEADER) &&
                   (((data->req).field_0x570 & 8) == 0)) {
                  pcVar4 = &(data->req).bytecount;
                  *pcVar4 = *pcVar4 + (data->req).hbuflen;
                }
                lVar28 = (data->req).maxdownload;
                if (lVar28 != -1) {
                  p_Var31 = local_70 + (data->req).bytecount + -lVar28;
                  if (lVar28 <= (long)(local_70 + (data->req).bytecount)) {
                    if ((p_Var31 != (_Bool *)0x0) && (((data->req).field_0x570 & 8) == 0)) {
                      local_60 = p_Var31;
                      Curl_infof(data,
                                 "Excess found in a read: excess = %zu, size = %ld, maxdownload = %ld, bytecount = %ld\n"
                                 ,p_Var31,(data->req).size);
                      p_Var31 = local_60;
                    }
                    local_70 = (_Bool *)((data->req).maxdownload - (data->req).bytecount);
                    if ((long)local_70 < 1) {
                      local_70 = (_Bool *)0x0;
                    }
                    piVar2 = &(data->req).keepon;
                    *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
                    local_40 = p_Var31;
                  }
                }
                lVar28 = (data->req).bytecount;
                (data->req).bytecount = (curl_off_t)(local_70 + lVar28);
                Curl_pgrsSetDownloadCounter(data,(curl_off_t)(local_70 + lVar28));
                uVar7 = *(ushort *)&(data->req).field_0x570;
                p_Var31 = extraout_RDX_14;
                if (((uVar7 & 0x20) == 0) &&
                   ((local_70 != (_Bool *)0x0 ||
                    ((data->req).badheader != HEADER_NORMAL || (uVar35 & 1) != 0)))) {
                  if (((uVar7 & 8) == 0) && ((data->req).badheader != HEADER_NORMAL)) {
                    sVar27 = (data->req).maxdownload;
                    if ((sVar27 == 0xffffffffffffffff) ||
                       ((long)(data->req).hbuflen <= (long)sVar27)) {
                      pcVar25 = (data->state).headerbuff;
                      sVar27 = (data->req).hbuflen;
                    }
                    else {
                      pcVar25 = (data->state).headerbuff;
                    }
                    CVar21 = Curl_client_write(conn,1,pcVar25,sVar27);
                    local_60 = (_Bool *)CONCAT44(local_60._4_4_,1);
                    p_Var31 = extraout_RDX_15;
                    if (CVar21 != CURLE_OK) goto LAB_0012a52a;
                    CVar21 = CURLE_OK;
                  }
                  if ((data->req).badheader < HEADER_ALLBAD) {
                    if ((((conn->data->set).field_0x87c & 0x80) == 0) &&
                       (writer = (data->req).writer_stack, writer != (contenc_writer *)0x0)) {
                      if (((data->req).field_0x570 & 8) == 0) {
                        CVar21 = Curl_unencode_write(conn,writer,(data->req).str,(size_t)local_70);
                        p_Var31 = extraout_RDX_16;
                      }
                    }
                    else if (((data->req).field_0x570 & 8) == 0) {
                      CVar21 = Curl_client_write(conn,1,(data->req).str,(size_t)local_70);
                      p_Var31 = extraout_RDX_17;
                    }
                  }
                  (data->req).badheader = HEADER_NORMAL;
                  local_60 = (_Bool *)CONCAT44(local_60._4_4_,1);
                  if (CVar21 != CURLE_OK) goto LAB_0012a52a;
                  CVar21 = CURLE_OK;
                }
                goto LAB_0012a7a8;
              }
              if ((data->req).newurl != (char *)0x0) {
                if (((conn->bits).field_0x4 & 1) != 0) {
                  piVar2 = &(data->req).keepon;
                  *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
                  *local_50 = true;
                  local_74 = CURLE_OK;
                  goto LAB_0012a895;
                }
                *(ushort *)&(data->req).field_0x570 = uVar7 | 8;
                Curl_infof(data,"Ignoring the response-body\n");
              }
              lVar28 = (data->state).resume_from;
              if (((lVar28 == 0) || (uVar7 = *(ushort *)&(data->req).field_0x570, (uVar7 & 2) != 0))
                 || (((uVar7 & 8) != 0 || ((data->set).httpreq != HTTPREQ_GET)))) {
                if ((((data->set).timecondition == CURL_TIMECOND_NONE) ||
                    ((data->state).range != (char *)0x0)) ||
                   (_Var20 = Curl_meets_timecondition(data,(data->req).timeofdoc), _Var20))
                goto LAB_0012a8d2;
                *local_50 = true;
                (data->info).httpcode = 0x130;
                local_74 = CURLE_OK;
                Curl_infof(data,"Simulate a HTTP 304 response!\n");
                local_60 = (_Bool *)CONCAT44(local_60._4_4_,1);
                Curl_conncontrol(conn,1);
                p_Var31 = extraout_RDX_18;
              }
              else {
                if ((data->req).size != lVar28) {
                  Curl_failf(data,"HTTP server doesn\'t seem to support byte ranges. Cannot resume."
                            );
                  local_74 = CURLE_RANGE_ERROR;
                  p_Var31 = extraout_RDX_19;
                  goto LAB_0012a895;
                }
                local_74 = CURLE_OK;
                Curl_infof(data,"The entire document is already downloaded");
                local_60 = (_Bool *)CONCAT44(local_60._4_4_,1);
                Curl_conncontrol(conn,1);
                piVar2 = &(data->req).keepon;
                *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
                *local_50 = true;
                p_Var31 = extraout_RDX_07;
              }
            }
            else {
              Curl_conncontrol(conn,2);
              *local_50 = true;
              local_74 = CURLE_WEIRD_SERVER_REPLY;
              p_Var31 = extraout_RDX_09;
LAB_0012a895:
              local_60 = (_Bool *)CONCAT44(local_60._4_4_,1);
            }
LAB_0012a89d:
            uVar35 = 1;
          }
        }
      }
      else {
        CVar21 = Curl_read(conn,conn->sockfd,(data->req).buf,sVar27,(ssize_t *)&local_70);
        p_Var31 = extraout_RDX_00;
        if (CVar21 == CURLE_OK) goto LAB_0012a476;
        uVar35 = 2;
        if (CVar21 != CURLE_AGAIN) {
LAB_0012a52a:
          uVar35 = 1;
          local_74 = CVar21;
        }
      }
LAB_0012a54c:
      if (uVar35 != 0) {
        if (uVar35 == 2) goto LAB_0012adfc;
        comeback = (_Bool *)(ulong)local_74;
        done = local_50;
        uVar35 = (uint)local_60;
        goto LAB_0012ae54;
      }
      if (((conn->handler->protocol & 0x30) == 0) &&
         (_Var20 = Curl_ssl_data_pending(conn,0), p_Var31 = extraout_RDX_03, !_Var20))
      goto LAB_0012adfc;
      bVar36 = iVar22 != 0;
      iVar22 = iVar22 + -1;
    } while (bVar36);
    iVar22 = -1;
LAB_0012adfc:
    done = local_50;
    if (iVar22 < 1) {
      conn->cselect_bits = 1;
      *local_38 = true;
    }
    comeback = (_Bool *)0x0;
    uVar35 = (uint)local_60;
    if ((((data->req).keepon & 3U) == 2) && (((conn->bits).field_0x4 & 1) != 0)) {
      comeback = (_Bool *)0x0;
      Curl_infof(data,"we are done reading and this is set to close, stop send\n");
      piVar2 = &(data->req).keepon;
      *(byte *)piVar2 = (byte)*piVar2 & 0xfd;
    }
LAB_0012ae54:
    if (((int)comeback != 0) || (*done != false)) goto LAB_0012b078;
  }
  if ((uVar34 & (data->req).keepon & 2) != 0) {
    if (((data->req).bytecount == 0) && ((data->req).writebytecount == 0)) {
      Curl_pgrsTime(data,TIMER_STARTTRANSFER);
    }
    uVar34 = uVar35 | 2;
    if ((data->req).upload_present == 0) {
      if ((data->state).ulbuf == (char *)0x0) {
        pcVar25 = (char *)(*Curl_cmalloc)((data->set).upload_buffer_size);
        (data->state).ulbuf = pcVar25;
        if (pcVar25 != (char *)0x0) goto LAB_0012ac73;
        CVar21 = CURLE_OUT_OF_MEMORY;
        bVar36 = false;
      }
      else {
LAB_0012ac73:
        CVar21 = CURLE_OK;
        bVar36 = true;
      }
      if (!bVar36) goto LAB_0012ae7d;
      (data->req).upload_fromhere = (data->state).ulbuf;
      if (((data->req).field_0x570 & 4) == 0) {
        pvVar9 = (data->req).protop;
        if (((data->req).exp100 == EXP100_SENDING_REQUEST) && (*(int *)((long)pvVar9 + 0x208) == 2))
        {
          (data->req).exp100 = EXP100_AWAITING_CONTINUE;
          piVar2 = &(data->req).keepon;
          *(byte *)piVar2 = (byte)*piVar2 & 0xfd;
          cVar37 = Curl_now();
          (data->req).start100.tv_sec = cVar37.tv_sec;
          (data->req).start100.tv_usec = cVar37.tv_usec;
          uVar34 = uVar35 & 0xfffffffd;
          bVar36 = false;
          Curl_expire(data,(data->set).expect_100_timeout,EXPIRE_100_TIMEOUT);
          iVar22 = 2;
        }
        else {
          pCVar29 = conn->handler;
          if ((pCVar29->protocol & 0x40003) == 0) {
            bVar36 = false;
          }
          else {
            bVar36 = *(int *)((long)pvVar9 + 0x208) == 1;
          }
          CVar23 = Curl_fillreadbuffer(conn,(data->set).upload_buffer_size,(size_t *)&local_70);
          CVar21 = (CURLcode)pCVar29;
          if (CVar23 == CURLE_OK) {
            iVar22 = 0;
            comeback = local_70;
          }
          else {
            iVar22 = 1;
            CVar21 = CVar23;
          }
        }
        if (iVar22 != 2) {
          if (iVar22 != 0) goto LAB_0012ae7d;
          goto LAB_0012b0c6;
        }
      }
      else {
        bVar36 = false;
        comeback = (_Bool *)0x0;
LAB_0012b0c6:
        if ((comeback != (_Bool *)0x0) || (((data->req).keepon & 0x20) == 0)) {
          if (0 < (long)comeback) {
            (data->req).upload_present = (ssize_t)comeback;
            if ((!bVar36) && ((*(ushort *)&(data->set).field_0x878 & 0x840) != 0)) {
              if ((data->state).scratch == (char *)0x0) {
                pcVar25 = (char *)(*Curl_cmalloc)((data->set).upload_buffer_size * 2);
                (data->state).scratch = pcVar25;
                if (pcVar25 == (char *)0x0) {
                  Curl_failf(data,"Failed to alloc scratch buffer!");
                  CVar21 = CURLE_OUT_OF_MEMORY;
                  goto LAB_0012ae7d;
                }
              }
              p_Var31 = (_Bool *)0x1;
              if (1 < (long)comeback) {
                p_Var31 = comeback;
              }
              p_Var30 = (_Bool *)0x0;
              p_Var33 = (_Bool *)0x0;
              do {
                cVar6 = (data->req).upload_fromhere[(long)p_Var30];
                pcVar25 = (data->state).scratch;
                if (cVar6 == '\n') {
                  p_Var1 = p_Var33 + 1;
                  pcVar25[(long)p_Var33] = '\r';
                  ((data->state).scratch + 1)[(long)p_Var33] = '\n';
                  p_Var33 = p_Var1;
                  if ((((data->set).field_0x878 & 0x40) == 0) &&
                     (lVar28 = (data->state).infilesize, lVar28 != -1)) {
                    (data->state).infilesize = lVar28 + 1;
                  }
                }
                else {
                  pcVar25[(long)p_Var33] = cVar6;
                }
                p_Var30 = p_Var30 + 1;
                p_Var33 = p_Var33 + 1;
              } while (p_Var31 != p_Var30);
              if (p_Var33 != comeback) {
                (data->req).upload_fromhere = (data->state).scratch;
                (data->req).upload_present = (ssize_t)p_Var33;
              }
            }
            goto LAB_0012a38d;
          }
          goto LAB_0012b1c7;
        }
      }
      goto LAB_0012ae7b;
    }
LAB_0012a38d:
    CVar21 = Curl_write(conn,conn->writesockfd,(data->req).upload_fromhere,
                        (data->req).upload_present,(ssize_t *)&local_70);
    if (CVar21 == CURLE_OK) {
      if (((data->set).field_0x87b & 0x40) != 0) {
        Curl_debug(data,CURLINFO_DATA_OUT,(data->req).upload_fromhere,(size_t)local_70);
      }
      lVar28 = (data->req).writebytecount;
      (data->req).writebytecount = (curl_off_t)(local_70 + lVar28);
      Curl_pgrsSetUploadCounter(data,(curl_off_t)(local_70 + lVar28));
      uVar7 = *(ushort *)&(data->req).field_0x570;
      if (((uVar7 & 0x140) != 0x40) && ((data->req).writebytecount == (data->state).infilesize)) {
        *(ushort *)&(data->req).field_0x570 = uVar7 | 4;
        Curl_infof(data,"We are completely uploaded and fine\n");
      }
      lVar28 = (data->req).upload_present - (long)local_70;
      if (lVar28 != 0) {
        (data->req).upload_present = lVar28;
        ppcVar5 = &(data->req).upload_fromhere;
        *ppcVar5 = *ppcVar5 + (long)local_70;
        goto LAB_0012ae7b;
      }
      if ((data->state).ulbuf == (char *)0x0) {
        pcVar25 = (char *)(*Curl_cmalloc)((data->set).upload_buffer_size);
        (data->state).ulbuf = pcVar25;
        if (pcVar25 != (char *)0x0) goto LAB_0012adbf;
        CVar21 = CURLE_OUT_OF_MEMORY;
        bVar36 = false;
      }
      else {
LAB_0012adbf:
        CVar21 = CURLE_OK;
        bVar36 = true;
      }
      if (bVar36) {
        (data->req).upload_fromhere = (data->state).ulbuf;
        (data->req).upload_present = 0;
        if (((data->req).field_0x570 & 4) != 0) {
LAB_0012b1c7:
          piVar2 = &(data->req).keepon;
          *(byte *)piVar2 = (byte)*piVar2 & 0xfd;
          if ((((conn->bits).field_0x6 & 1) == 0) ||
             (CVar21 = Curl_readrewind(conn), CVar21 == CURLE_OK)) {
            CVar21 = CURLE_OK;
          }
          if (CVar21 != CURLE_OK) goto LAB_0012ae7d;
        }
LAB_0012ae7b:
        CVar21 = CURLE_OK;
      }
    }
LAB_0012ae7d:
    uVar35 = uVar34;
    comeback = (_Bool *)(ulong)CVar21;
    if (CVar21 != CURLE_OK) goto LAB_0012b078;
  }
  cVar37 = Curl_now();
  (data->req).now.tv_sec = cVar37.tv_sec;
  (data->req).now.tv_usec = cVar37.tv_usec;
  if (((uVar35 == 0) && ((data->req).exp100 == EXP100_AWAITING_CONTINUE)) &&
     (uVar12 = (data->req).start100.tv_sec, uVar13 = (data->req).start100.tv_usec,
     older.tv_usec = uVar13, older.tv_sec = uVar12, newer._12_4_ = 0,
     newer.tv_sec = SUB128(cVar37._0_12_,0), newer.tv_usec = SUB124(cVar37._0_12_,8),
     older._12_4_ = 0, tVar26 = Curl_timediff(newer,older), (data->set).expect_100_timeout <= tVar26
     )) {
    (data->req).exp100 = EXP100_SEND_DATA;
    piVar2 = &(data->req).keepon;
    *(byte *)piVar2 = (byte)*piVar2 | 2;
    Curl_expire_done(data,EXPIRE_100_TIMEOUT);
    Curl_infof(data,"Done waiting for 100-continue\n");
  }
  iVar22 = Curl_pgrsUpdate(conn);
  comeback = (_Bool *)0x2a;
  if (iVar22 == 0) {
    uVar14 = (data->req).now.tv_sec;
    uVar15 = (data->req).now.tv_usec;
    cVar37.tv_usec = uVar15;
    cVar37.tv_sec = uVar14;
    cVar37._12_4_ = 0;
    CVar21 = Curl_speedcheck(data,cVar37);
    comeback = (_Bool *)(ulong)CVar21;
  }
  if ((int)comeback != 0) goto LAB_0012b078;
  if ((data->req).keepon == 0) {
    uVar34 = (uint)*(undefined8 *)&(data->set).field_0x878;
    if ((uVar34 >> 0x1c & 1) == 0) {
      lVar28 = (data->req).size;
      if (((lVar28 == -1) || (lVar11 = (data->req).bytecount, lVar28 == lVar11)) ||
         ((lVar11 == lVar28 + (data->state).crlf_conversions || ((data->req).newurl != (char *)0x0))
         )) {
        if ((((uVar34 >> 0x1c & 1) != 0) || (((data->req).field_0x570 & 0x20) == 0)) ||
           ((conn->chunk).state == CHUNK_STOP)) goto LAB_0012b004;
        Curl_failf(data,"transfer closed with outstanding read data remaining");
      }
      else {
        Curl_failf(data,"transfer closed with %ld bytes remaining to read");
      }
      comeback = (_Bool *)0x12;
      goto LAB_0012b078;
    }
LAB_0012b004:
    iVar22 = Curl_pgrsUpdate(conn);
    comeback = (_Bool *)0x2a;
    if (iVar22 != 0) goto LAB_0012b078;
  }
  else {
    tVar26 = Curl_timeleft(data,&(data->req).now,false);
    if (tVar26 < 0) {
      lVar28 = (data->req).size;
      uVar16 = (data->req).now.tv_sec;
      uVar17 = (data->req).now.tv_usec;
      newer_00.tv_usec = uVar17;
      newer_00.tv_sec = uVar16;
      uVar18 = (data->progress).t_startsingle.tv_sec;
      uVar19 = (data->progress).t_startsingle.tv_usec;
      older_00.tv_usec = uVar19;
      older_00.tv_sec = uVar18;
      newer_00._12_4_ = 0;
      older_00._12_4_ = 0;
      tVar26 = Curl_timediff(newer_00,older_00);
      cVar10 = (data->req).bytecount;
      if (lVar28 == -1) {
        Curl_failf(data,"Operation timed out after %ld milliseconds with %ld bytes received",tVar26,
                   cVar10);
      }
      else {
        Curl_failf(data,
                   "Operation timed out after %ld milliseconds with %ld out of %ld bytes received",
                   tVar26,cVar10,(data->req).size);
      }
      comeback = (_Bool *)0x1c;
      goto LAB_0012b078;
    }
  }
  *done = ((data->req).keepon & 0x33) == 0;
  comeback = (_Bool *)0x0;
LAB_0012b078:
  return (CURLcode)comeback;
}

Assistant:

CURLcode Curl_readwrite(struct connectdata *conn,
                        struct Curl_easy *data,
                        bool *done,
                        bool *comeback)
{
  struct SingleRequest *k = &data->req;
  CURLcode result;
  int didwhat = 0;

  curl_socket_t fd_read;
  curl_socket_t fd_write;
  int select_res = conn->cselect_bits;

  conn->cselect_bits = 0;

  /* only use the proper socket if the *_HOLD bit is not set simultaneously as
     then we are in rate limiting state in that transfer direction */

  if((k->keepon & KEEP_RECVBITS) == KEEP_RECV)
    fd_read = conn->sockfd;
  else
    fd_read = CURL_SOCKET_BAD;

  if((k->keepon & KEEP_SENDBITS) == KEEP_SEND)
    fd_write = conn->writesockfd;
  else
    fd_write = CURL_SOCKET_BAD;

  if(conn->data->state.drain) {
    select_res |= CURL_CSELECT_IN;
    DEBUGF(infof(data, "Curl_readwrite: forcibly told to drain data\n"));
  }

  if(!select_res) /* Call for select()/poll() only, if read/write/error
                     status is not known. */
    select_res = Curl_socket_check(fd_read, CURL_SOCKET_BAD, fd_write, 0);

  if(select_res == CURL_CSELECT_ERR) {
    failf(data, "select/poll returned error");
    return CURLE_SEND_ERROR;
  }

  /* We go ahead and do a read if we have a readable socket or if
     the stream was rewound (in which case we have data in a
     buffer) */
  if((k->keepon & KEEP_RECV) &&
     ((select_res & CURL_CSELECT_IN) || conn->bits.stream_was_rewound)) {

    result = readwrite_data(data, conn, k, &didwhat, done, comeback);
    if(result || *done)
      return result;
  }

  /* If we still have writing to do, we check if we have a writable socket. */
  if((k->keepon & KEEP_SEND) && (select_res & CURL_CSELECT_OUT)) {
    /* write */

    result = readwrite_upload(data, conn, &didwhat);
    if(result)
      return result;
  }

  k->now = Curl_now();
  if(didwhat) {
    ;
  }
  else {
    /* no read no write, this is a timeout? */
    if(k->exp100 == EXP100_AWAITING_CONTINUE) {
      /* This should allow some time for the header to arrive, but only a
         very short time as otherwise it'll be too much wasted time too
         often. */

      /* Quoting RFC2616, section "8.2.3 Use of the 100 (Continue) Status":

         Therefore, when a client sends this header field to an origin server
         (possibly via a proxy) from which it has never seen a 100 (Continue)
         status, the client SHOULD NOT wait for an indefinite period before
         sending the request body.

      */

      timediff_t ms = Curl_timediff(k->now, k->start100);
      if(ms >= data->set.expect_100_timeout) {
        /* we've waited long enough, continue anyway */
        k->exp100 = EXP100_SEND_DATA;
        k->keepon |= KEEP_SEND;
        Curl_expire_done(data, EXPIRE_100_TIMEOUT);
        infof(data, "Done waiting for 100-continue\n");
      }
    }
  }

  if(Curl_pgrsUpdate(conn))
    result = CURLE_ABORTED_BY_CALLBACK;
  else
    result = Curl_speedcheck(data, k->now);
  if(result)
    return result;

  if(k->keepon) {
    if(0 > Curl_timeleft(data, &k->now, FALSE)) {
      if(k->size != -1) {
        failf(data, "Operation timed out after %" CURL_FORMAT_TIMEDIFF_T
              " milliseconds with %" CURL_FORMAT_CURL_OFF_T " out of %"
              CURL_FORMAT_CURL_OFF_T " bytes received",
              Curl_timediff(k->now, data->progress.t_startsingle),
              k->bytecount, k->size);
      }
      else {
        failf(data, "Operation timed out after %" CURL_FORMAT_TIMEDIFF_T
              " milliseconds with %" CURL_FORMAT_CURL_OFF_T " bytes received",
              Curl_timediff(k->now, data->progress.t_startsingle),
              k->bytecount);
      }
      return CURLE_OPERATION_TIMEDOUT;
    }
  }
  else {
    /*
     * The transfer has been performed. Just make some general checks before
     * returning.
     */

    if(!(data->set.opt_no_body) && (k->size != -1) &&
       (k->bytecount != k->size) &&
#ifdef CURL_DO_LINEEND_CONV
       /* Most FTP servers don't adjust their file SIZE response for CRLFs,
          so we'll check to see if the discrepancy can be explained
          by the number of CRLFs we've changed to LFs.
       */
       (k->bytecount != (k->size + data->state.crlf_conversions)) &&
#endif /* CURL_DO_LINEEND_CONV */
       !k->newurl) {
      failf(data, "transfer closed with %" CURL_FORMAT_CURL_OFF_T
            " bytes remaining to read", k->size - k->bytecount);
      return CURLE_PARTIAL_FILE;
    }
    if(!(data->set.opt_no_body) && k->chunk &&
       (conn->chunk.state != CHUNK_STOP)) {
      /*
       * In chunked mode, return an error if the connection is closed prior to
       * the empty (terminating) chunk is read.
       *
       * The condition above used to check for
       * conn->proto.http->chunk.datasize != 0 which is true after reading
       * *any* chunk, not just the empty chunk.
       *
       */
      failf(data, "transfer closed with outstanding read data remaining");
      return CURLE_PARTIAL_FILE;
    }
    if(Curl_pgrsUpdate(conn))
      return CURLE_ABORTED_BY_CALLBACK;
  }

  /* Now update the "done" boolean we return */
  *done = (0 == (k->keepon&(KEEP_RECV|KEEP_SEND|
                            KEEP_RECV_PAUSE|KEEP_SEND_PAUSE))) ? TRUE : FALSE;

  return CURLE_OK;
}